

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

void record_pipelines_pnext_shader(StateRecorder *recorder)

{
  bool bVar1;
  VkPipeline_T *pVVar2;
  undefined1 local_140 [8];
  VkGraphicsPipelineCreateInfo gpipe;
  VkComputePipelineCreateInfo pipe;
  VkShaderModuleValidationCacheCreateInfoEXT validate_info;
  VkShaderModuleCreateInfo module;
  StateRecorder *recorder_local;
  
  memset(&validate_info.validationCache,0,0x28);
  validate_info.validationCache._0_4_ = 0x10;
  pipe.basePipelineIndex = 0x3b9d3b01;
  pipe._92_4_ = 0;
  validate_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  validate_info._4_4_ = 0;
  validate_info.pNext = (void *)0x0;
  memset(&gpipe.basePipelineIndex,0,0x60);
  gpipe.basePipelineIndex = 0x1d;
  memset(local_140,0,0x90);
  local_140._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  pipe.flags = 0x12;
  pipe.stage.pNext._4_4_ = 0x20;
  pipe.stage.flags = 0;
  pipe.stage.stage = 0;
  pipe.stage.module = (VkShaderModule)anon_var_dwarf_18551;
  pipe.stage._0_8_ = &validate_info.validationCache;
  gpipe.pNext._4_4_ = 1;
  gpipe._16_8_ = &pipe.flags;
  pVVar2 = fake_handle<VkPipeline_T*>(0x7c3);
  bVar1 = Fossilize::StateRecorder::record_compute_pipeline
                    (recorder,pVVar2,(VkComputePipelineCreateInfo *)&gpipe.basePipelineIndex,
                     (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(0x7c4);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_140,(VkPipeline *)0x0,0,0
                     ,(VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  return;
}

Assistant:

static void record_pipelines_pnext_shader(StateRecorder &recorder)
{
	VkShaderModuleCreateInfo module = { VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO };
	static const uint32_t data[] = { 1, 2, 3 };
	module.codeSize = sizeof(data);
	module.pCode = data;

	VkShaderModuleValidationCacheCreateInfoEXT validate_info = { VK_STRUCTURE_TYPE_SHADER_MODULE_VALIDATION_CACHE_CREATE_INFO_EXT };
	module.pNext = &validate_info;

	VkComputePipelineCreateInfo pipe = { VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO };
	VkGraphicsPipelineCreateInfo gpipe = { VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO };
	pipe.stage.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
	pipe.stage.stage = VK_SHADER_STAGE_COMPUTE_BIT;
	pipe.stage.module = VK_NULL_HANDLE;
	pipe.stage.pName = "foobar";
	pipe.stage.pNext = &module;
	gpipe.stageCount = 1;
	gpipe.pStages = &pipe.stage;

	if (!recorder.record_compute_pipeline(fake_handle<VkPipeline>(1987), pipe, nullptr, 0))
		abort();
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(1988), gpipe, nullptr, 0))
		abort();
}